

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

LabeledDataset * __thiscall
notch::core::LabeledDataset::append(LabeledDataset *this,Input *input,Output *output)

{
  size_t sVar1;
  size_t sVar2;
  Output *output_local;
  Input *input_local;
  LabeledDataset *this_local;
  
  if (this->nSamples == 0) {
    sVar2 = std::valarray<float>::size(input);
    this->inputDimension = sVar2;
    sVar2 = std::valarray<float>::size(output);
    this->outputDimension = sVar2;
  }
  else {
    sVar2 = this->inputDimension;
    sVar1 = std::valarray<float>::size(input);
    if (sVar2 != sVar1) {
      __assert_fail("inputDimension == input.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xed,"LabeledDataset &notch::LabeledDataset::append(Input &, Output &)");
    }
    sVar2 = this->outputDimension;
    sVar1 = std::valarray<float>::size(output);
    if (sVar2 != sVar1) {
      __assert_fail("outputDimension == output.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xee,"LabeledDataset &notch::LabeledDataset::append(Input &, Output &)");
    }
  }
  this->nSamples = this->nSamples + 1;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->inputs,input);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->outputs,output);
  return this;
}

Assistant:

LabeledDataset &append(Input &input, Output &output) {
        if (nSamples != 0) {
            assert(inputDimension == input.size());
            assert(outputDimension == output.size());
        } else {
            inputDimension = input.size();
            outputDimension = output.size();
        }
        nSamples++;
        inputs.push_back(input);
        outputs.push_back(output);
        return *this;
    }